

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageInputTest.cpp
# Opt level: O3

void __thiscall imageInput_invalidFile_Test::TestBody(imageInput_invalidFile_Test *this)

{
  UntypedFunctionMockerBase *this_00;
  bool bVar1;
  long *plVar2;
  MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *pMVar3;
  TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *pTVar4;
  ostream *this_01;
  Mat *this_02;
  long local_580;
  ifstream infile;
  int aiStack_560 [122];
  Mat local_378 [96];
  Mat local_318 [96];
  undefined1 local_2b8 [8];
  ImageInput imageInput;
  Mat m;
  int iStack_244;
  linked_ptr_internal local_240;
  Mat local_1e0 [96];
  Mat local_180 [144];
  undefined1 local_f0 [8];
  Mat z;
  linked_ptr_internal local_e0;
  long *local_90 [2];
  long local_80 [2];
  size_type *local_70;
  string fileName;
  linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_40;
  
  cv::Mat::Mat((Mat *)local_2b8);
  plVar2 = (long *)operator_new(0x158);
  memset(plVar2,0,0x158);
  *plVar2 = (long)&PTR_read_001814a0;
  this_00 = (UntypedFunctionMockerBase *)(plVar2 + 1);
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase(this_00);
  plVar2[10] = (long)this_00;
  plVar2[0xc] = 0;
  plVar2[0xd] = (long)(plVar2 + 0xd);
  plVar2[0xb] = (long)&PTR__MatcherBase_001815d0;
  plVar2[1] = (long)&PTR__FunctionMockerBase_00181500;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)(plVar2 + 0xe));
  plVar2[0x17] = (long)(plVar2 + 0xe);
  plVar2[0x19] = 0;
  plVar2[0x1a] = (long)(plVar2 + 0x1a);
  plVar2[0x18] = (long)&PTR__MatcherBase_00180fb0;
  plVar2[0xe] = (long)&PTR__FunctionMockerBase_001816a8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)(plVar2 + 0x1b));
  plVar2[0x24] = (long)(plVar2 + 0x1b);
  plVar2[0x26] = 0;
  plVar2[0x27] = (long)(plVar2 + 0x27);
  plVar2[0x25] = (long)&PTR__MatcherBase_00181888;
  plVar2[0x29] = 0;
  plVar2[0x2a] = (long)(plVar2 + 0x2a);
  plVar2[0x28] = (long)&PTR__MatcherBase_00180fb0;
  plVar2[0x1b] = (long)&PTR__FunctionMockerBase_001817b8;
  imageInput._88_8_ = *(long *)(*plVar2 + -0x30) + (long)plVar2;
  local_70 = &fileName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"../test/23_Human.jpg","");
  std::ifstream::ifstream(&local_580,(string *)&local_70,_S_in);
  if (*(int *)((long)aiStack_560 + *(long *)(local_580 + -0x18)) == 0) {
    cv::Mat::zeros((int)&imageInput + 0x60,0x2d0,0x500);
    cv::Mat::Mat((Mat *)local_f0);
    (*(imageInput.reader)->_vptr_IReaderWriter[3])
              (imageInput.reader,&imageInput.reader,(Mat *)local_f0,0xffffffff);
    cv::Mat::~Mat(local_180);
    cv::Mat::~Mat(local_1e0);
    cv::Mat::~Mat((Mat *)&local_240);
    _m = (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(8);
    (_m->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherDescriberInterface_00181960;
    imageInput.reader = (IReaderWriter *)&PTR__MatcherBase_001815d0;
    local_240.next_ = &local_240;
    testing::internal::UntypedFunctionMockerBase::RegisterOwner(this_00,plVar2);
    pMVar3 = testing::internal::
             FunctionMocker<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             ::With((FunctionMocker<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)this_00,
                    (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&imageInput.reader);
    pTVar4 = testing::internal::
             MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             ::InternalExpectedAt
                       (pMVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
                        ,0x3b,"*readerMock","read(_)");
    cv::Mat::Mat(local_378,(Mat *)local_f0);
    testing::Return<cv::Mat>((Mat *)(fileName.field_2._M_local_buf + 8));
    testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_40);
    testing::internal::
    TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::WillRepeatedly(pTVar4,(Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_40);
    testing::internal::
    linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
    ::~linked_ptr(&local_40);
    testing::internal::linked_ptr<cv::Mat>::depart
              ((linked_ptr<cv::Mat> *)((long)&fileName.field_2 + 8));
    cv::Mat::~Mat(local_378);
    imageInput.reader = (IReaderWriter *)&PTR__MatcherBase_00181618;
    testing::internal::
    linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~linked_ptr((linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&m);
    this_02 = (Mat *)local_f0;
  }
  else {
    cv::Mat::Mat((Mat *)&imageInput.reader);
    _z = (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(8);
    (_z->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherDescriberInterface_00181960;
    local_e0.next_ = &stack0xffffffffffffff20;
    local_f0 = (undefined1  [8])&PTR__MatcherBase_001815d0;
    testing::internal::UntypedFunctionMockerBase::RegisterOwner(this_00,plVar2);
    pMVar3 = testing::internal::
             FunctionMocker<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             ::With((FunctionMocker<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)this_00,
                    (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_f0);
    pTVar4 = testing::internal::
             MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             ::InternalExpectedAt
                       (pMVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
                        ,0x40,"*readerMock","read(_)");
    cv::Mat::Mat(local_318,(Mat *)&imageInput.reader);
    testing::Return<cv::Mat>((Mat *)(fileName.field_2._M_local_buf + 8));
    testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_40);
    testing::internal::
    TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::WillRepeatedly(pTVar4,(Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_40);
    testing::internal::
    linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
    ::~linked_ptr(&local_40);
    testing::internal::linked_ptr<cv::Mat>::depart
              ((linked_ptr<cv::Mat> *)((long)&fileName.field_2 + 8));
    cv::Mat::~Mat(local_318);
    local_f0 = (undefined1  [8])&PTR__MatcherBase_00181618;
    testing::internal::
    linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~linked_ptr((linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&z);
    this_02 = (Mat *)&imageInput.reader;
  }
  cv::Mat::~Mat(this_02);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_70,fileName._M_dataplus._M_p + (long)local_70);
  ImageInput::readImage((ImageInput *)&imageInput.reader,(string *)local_2b8);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  this_01 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_m);
  std::__ostream_insert<char,std::char_traits<char>>(this_01," ",1);
  plVar2 = (long *)std::ostream::operator<<((ostream *)this_01,iStack_244);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  testing::Message::Message((Message *)local_f0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
             ,0x48,"Failed");
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
  if (local_f0 != (undefined1  [8])0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_f0 != (undefined1  [8])0x0)) {
      (**(code **)(*(_func_int **)local_f0 + 8))();
    }
  }
  cv::Mat::~Mat((Mat *)&imageInput.reader);
  std::ifstream::~ifstream(&local_580);
  if (local_70 != &fileName._M_string_length) {
    operator_delete(local_70,fileName._M_string_length + 1);
  }
  cv::Mat::~Mat((Mat *)local_2b8);
  return;
}

Assistant:

TEST(imageInput, invalidFile) {
  /// Instantiate objects for various classes
  ImageInput imageInput;
  ReaderWriterMock* readerMock = new ReaderWriterMock();
  /// Set mock to read images
  imageInput.setReader(readerMock);
  /// Declare file path
  const std::string fileName = "../test/23_Human.jpg";
  /// Add mock implementation to check validity of image file path
  std::ifstream infile(fileName);
  if (infile.good()) {
    /// If file path exist then return full mat file
    cv::Mat z = cv::Mat::zeros(720, 1280, CV_8U);
    EXPECT_CALL(*readerMock, read(_)).WillRepeatedly(
      Return(z));
  } else {
      /// If file path does not exist then return empty mat file
    cv::Mat m;
    EXPECT_CALL(*readerMock, read(_)).WillRepeatedly(
      Return(m));
  }

  try {
    /// try to read image
    cv::Mat result = imageInput.readImage(fileName);
    std::cout << result.rows << " " << result.cols << std::endl;
    FAIL();  // Expected std::invalid file path exception
  }
  catch(std::exception& err) {
    EXPECT_EQ(err.what(), std::string("Invalid File Path"));
  }
  /// delete mock object
  delete readerMock;
}